

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::clearConnections(QTreeViewPrivate *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 8) {
    QObject::disconnect((Connection *)((long)&(this->modelConnections)._M_elems[0].d_ptr + lVar1));
  }
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 8) {
    QObject::disconnect((Connection *)((long)&(this->headerConnections)._M_elems[0].d_ptr + lVar1));
  }
  QObject::disconnect(&this->selectionmodelConnection);
  QObject::disconnect(&this->sortHeaderConnection);
  QObject::disconnect(&this->animationConnection);
  return;
}

Assistant:

void QTreeViewPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : headerConnections)
        QObject::disconnect(connection);
    QObject::disconnect(selectionmodelConnection);
    QObject::disconnect(sortHeaderConnection);
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
}